

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

int duckdb::Cast::Operation<double,int>(double input)

{
  bool bVar1;
  InvalidInputException *this;
  double in_XMM0_Qa;
  int result;
  double in_stack_000001a8;
  string local_30 [36];
  int local_c [3];
  
  bVar1 = duckdb::TryCast::Operation<double,int>(in_XMM0_Qa,local_c,false);
  if (!bVar1) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<double,int>(in_stack_000001a8);
    duckdb::InvalidInputException::InvalidInputException(this,local_30);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return local_c[0];
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}